

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::operator->
          (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *this)

{
  __atomic_flag_data_type _Var1;
  atomic_flag *paVar2;
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_false> extraout_RDX;
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *in_RSI;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar3;
  SequencePointAwareDeleter local_40 [2];
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *this_local;
  undefined4 local_24;
  atomic_flag *local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_20 = &in_RSI->flush_concurrency_check_;
  local_24 = 5;
  LOCK();
  _Var1 = (local_20->super___atomic_flag_base)._M_i;
  (local_20->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  this_local = this;
  if (_Var1 != false) {
    __assert_fail("!flush_concurrency_check_.test_and_set()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                  ,0x7e,
                  "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::V9938>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::V9938>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                 );
  }
  flush(in_RSI);
  paVar2 = &in_RSI->flush_concurrency_check_;
  local_14 = 5;
  ___b = paVar2;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_14 == 3) {
    (paVar2->super___atomic_flag_base)._M_i = false;
  }
  else if (local_14 == 5) {
    LOCK();
    (paVar2->super___atomic_flag_base)._M_i = false;
    UNLOCK();
  }
  else {
    (paVar2->super___atomic_flag_base)._M_i = false;
  }
  SequencePointAwareDeleter::SequencePointAwareDeleter(local_40,in_RSI);
  std::
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,HalfCycles,1,1>::SequencePointAwareDeleter>
  ::
  unique_ptr<JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,HalfCycles,1,1>::SequencePointAwareDeleter,void>
            ((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,HalfCycles,1,1>::SequencePointAwareDeleter>
              *)this,&in_RSI->object_,local_40);
  uVar3._M_t.
  super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  uVar3._M_t.
  super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  .
  super__Tuple_impl<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  .
  super__Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
  ._M_head_impl.actor_ =
       (_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
        )(_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )this;
  return (unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
          )uVar3._M_t.
           super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ;
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}